

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFSCharter.cpp
# Opt level: O1

void __thiscall FSCConnection::FSCConnection(FSCConnection *this)

{
  char *pcVar1;
  ulong uVar2;
  char url [128];
  char local_b8 [136];
  
  LTOnlineChannel::LTOnlineChannel
            ((LTOnlineChannel *)this,DR_CHANNEL_FSCHARTER,CHT_TRACKING_DATA,"FSCharter");
  (this->super_LTFlightDataChannel).timeLastAcCnt = 0.0;
  (this->super_LTFlightDataChannel).numAcServed = 0;
  (this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel =
       (_func_int **)&PTR__FSCConnection_002def48;
  (this->base_url)._M_dataplus._M_p = (pointer)&(this->base_url).field_2;
  (this->base_url)._M_string_length = 0;
  (this->base_url).field_2._M_local_buf[0] = '\0';
  this->fscStatus = FSC_STATUS_NONE;
  this->pCurlHeader = (curl_slist *)0x0;
  (this->token)._M_dataplus._M_p = (pointer)&(this->token).field_2;
  (this->token)._M_string_length = 0;
  (this->token).field_2._M_local_buf[0] = '\0';
  (this->token_type)._M_dataplus._M_p = (pointer)&(this->token_type).field_2;
  (this->token_type)._M_string_length = 0;
  (this->token_type).field_2._M_local_buf[0] = '\0';
  (this->error_status)._M_dataplus._M_p = (pointer)&(this->error_status).field_2;
  (this->error_status)._M_string_length = 0;
  (this->error_status).field_2._M_local_buf[0] = '\0';
  (this->error_message)._M_dataplus._M_p = (pointer)&(this->error_message).field_2;
  (this->error_message)._M_string_length = 0;
  (this->error_message).field_2._M_local_buf[0] = '\0';
  this->error_code = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.urlName
             ,0,(char *)(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                        urlName._M_string_length,0x27bfce);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.urlLink
             ,0,(char *)(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                        urlLink._M_string_length,0x252ade);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                     urlPopup,0,
             (char *)(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                     urlPopup._M_string_length,0x252b01);
  local_b8[0x70] = '\0';
  local_b8[0x71] = '\0';
  local_b8[0x72] = '\0';
  local_b8[0x73] = '\0';
  local_b8[0x74] = '\0';
  local_b8[0x75] = '\0';
  local_b8[0x76] = '\0';
  local_b8[0x77] = '\0';
  local_b8[0x78] = '\0';
  local_b8[0x79] = '\0';
  local_b8[0x7a] = '\0';
  local_b8[0x7b] = '\0';
  local_b8[0x7c] = '\0';
  local_b8[0x7d] = '\0';
  local_b8[0x7e] = '\0';
  local_b8[0x7f] = '\0';
  local_b8[0x60] = '\0';
  local_b8[0x61] = '\0';
  local_b8[0x62] = '\0';
  local_b8[99] = '\0';
  local_b8[100] = '\0';
  local_b8[0x65] = '\0';
  local_b8[0x66] = '\0';
  local_b8[0x67] = '\0';
  local_b8[0x68] = '\0';
  local_b8[0x69] = '\0';
  local_b8[0x6a] = '\0';
  local_b8[0x6b] = '\0';
  local_b8[0x6c] = '\0';
  local_b8[0x6d] = '\0';
  local_b8[0x6e] = '\0';
  local_b8[0x6f] = '\0';
  local_b8[0x50] = '\0';
  local_b8[0x51] = '\0';
  local_b8[0x52] = '\0';
  local_b8[0x53] = '\0';
  local_b8[0x54] = '\0';
  local_b8[0x55] = '\0';
  local_b8[0x56] = '\0';
  local_b8[0x57] = '\0';
  local_b8[0x58] = '\0';
  local_b8[0x59] = '\0';
  local_b8[0x5a] = '\0';
  local_b8[0x5b] = '\0';
  local_b8[0x5c] = '\0';
  local_b8[0x5d] = '\0';
  local_b8[0x5e] = '\0';
  local_b8[0x5f] = '\0';
  local_b8[0x40] = '\0';
  local_b8[0x41] = '\0';
  local_b8[0x42] = '\0';
  local_b8[0x43] = '\0';
  local_b8[0x44] = '\0';
  local_b8[0x45] = '\0';
  local_b8[0x46] = '\0';
  local_b8[0x47] = '\0';
  local_b8[0x48] = '\0';
  local_b8[0x49] = '\0';
  local_b8[0x4a] = '\0';
  local_b8[0x4b] = '\0';
  local_b8[0x4c] = '\0';
  local_b8[0x4d] = '\0';
  local_b8[0x4e] = '\0';
  local_b8[0x4f] = '\0';
  local_b8[0x30] = '\0';
  local_b8[0x31] = '\0';
  local_b8[0x32] = '\0';
  local_b8[0x33] = '\0';
  local_b8[0x34] = '\0';
  local_b8[0x35] = '\0';
  local_b8[0x36] = '\0';
  local_b8[0x37] = '\0';
  local_b8[0x38] = '\0';
  local_b8[0x39] = '\0';
  local_b8[0x3a] = '\0';
  local_b8[0x3b] = '\0';
  local_b8[0x3c] = '\0';
  local_b8[0x3d] = '\0';
  local_b8[0x3e] = '\0';
  local_b8[0x3f] = '\0';
  local_b8[0x20] = '\0';
  local_b8[0x21] = '\0';
  local_b8[0x22] = '\0';
  local_b8[0x23] = '\0';
  local_b8[0x24] = '\0';
  local_b8[0x25] = '\0';
  local_b8[0x26] = '\0';
  local_b8[0x27] = '\0';
  local_b8[0x28] = '\0';
  local_b8[0x29] = '\0';
  local_b8[0x2a] = '\0';
  local_b8[0x2b] = '\0';
  local_b8[0x2c] = '\0';
  local_b8[0x2d] = '\0';
  local_b8[0x2e] = '\0';
  local_b8[0x2f] = '\0';
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8[0x14] = '\0';
  local_b8[0x15] = '\0';
  local_b8[0x16] = '\0';
  local_b8[0x17] = '\0';
  local_b8[0x18] = '\0';
  local_b8[0x19] = '\0';
  local_b8[0x1a] = '\0';
  local_b8[0x1b] = '\0';
  local_b8[0x1c] = '\0';
  local_b8[0x1d] = '\0';
  local_b8[0x1e] = '\0';
  local_b8[0x1f] = '\0';
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  uVar2 = (ulong)dataRefs.fscEnv;
  if (uVar2 < 2) {
    snprintf(local_b8,0x80,"https://%s/",FSC_ENV._M_elems[uVar2].server._M_dataplus._M_p);
    pcVar1 = (char *)(this->base_url)._M_string_length;
    strlen(local_b8);
    std::__cxx11::string::_M_replace((ulong)&this->base_url,0,pcVar1,(ulong)local_b8);
    return;
  }
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar2,2);
}

Assistant:

FSCConnection::FSCConnection () :
LTFlightDataChannel(DR_CHANNEL_FSCHARTER, FSC_NAME)
{
    // purely informational
    urlName  = FSC_CHECK_NAME;
    urlLink  = FSC_CHECK_URL;
    urlPopup = FSC_CHECK_POPUP;
    
    // base URL depends on environment in use
    char url[128] = "";
    snprintf(url, sizeof(url),
             FSC_BASE_URL,
             FSC_ENV.at(dataRefs.GetFSCEnv()).server.c_str());
    base_url = url;
}